

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O0

void writeTiledRgbaRIP2(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Rgba *pRVar5;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  Box2i range;
  int tileX;
  int tileY;
  int xLevel;
  int yLevel;
  Array2D<Imf_3_2::Rgba> pixels;
  TiledRgbaOutputFile out;
  int iVar6;
  undefined4 in_stack_ffffffffffffff04;
  Vec2<float> *this;
  int xMax;
  int in_stack_ffffffffffffff1c;
  int h;
  int in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int iVar7;
  undefined4 in_stack_ffffffffffffff54;
  int local_7c;
  int local_78;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  Array2D<Imf_3_2::Rgba> local_50;
  Vec2<float> local_38;
  Rgba local_30 [6];
  
  this = &local_38;
  Imath_3_2::Vec2<float>::Vec2(this,0.0,0.0);
  uVar1 = Imf_3_2::globalThreadCount();
  h = 3;
  xMax = 0;
  iVar6 = 0;
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,local_30,in_RDI,in_ESI,in_EDX,in_ECX,in_R8D,2,0,0xf);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
             ,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  local_60 = 0;
  while( true ) {
    iVar7 = local_60;
    iVar2 = Imf_3_2::TiledRgbaOutputFile::numYLevels();
    if (iVar2 <= iVar7) break;
    local_64 = 0;
    while( true ) {
      iVar7 = local_64;
      iVar2 = Imf_3_2::TiledRgbaOutputFile::numXLevels();
      if (iVar2 <= iVar7) break;
      local_68 = 0;
      while( true ) {
        iVar2 = local_68;
        iVar3 = Imf_3_2::TiledRgbaOutputFile::numYTiles((int)local_30);
        if (iVar3 <= iVar2) break;
        local_6c = 0;
        while( true ) {
          iVar3 = local_6c;
          iVar4 = Imf_3_2::TiledRgbaOutputFile::numXTiles((int)local_30);
          if (iVar4 <= iVar3) break;
          Imf_3_2::TiledRgbaOutputFile::dataWindowForTile
                    ((int)&local_7c,(int)local_30,local_6c,local_68);
          Imf_3_2::TiledRgbaOutputFile::levelWidth((int)local_30);
          Imf_3_2::TiledRgbaOutputFile::levelHeight((int)local_30);
          iVar6 = local_64;
          drawImage5((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff2c,uVar1),
                     in_stack_ffffffffffffff24,h,in_stack_ffffffffffffff1c,xMax,
                     (int)((ulong)this >> 0x20),iVar3,iVar2,iVar7);
          pRVar5 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_50,(long)-local_78);
          Imf_3_2::TiledRgbaOutputFile::setFrameBuffer(local_30,(ulong)(pRVar5 + -local_7c),1);
          Imf_3_2::TiledRgbaOutputFile::writeTile((int)local_30,local_6c,local_68,local_64);
          local_6c = local_6c + 1;
        }
        local_68 = local_68 + 1;
      }
      local_64 = local_64 + 1;
    }
    local_60 = local_60 + 1;
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
            ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff04,iVar6));
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_30);
  return;
}

Assistant:

void
writeTiledRgbaRIP2 (
    const char fileName[], int width, int height, int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with ripmap levels using a tile-sized framebuffer.
    //

    TiledRgbaOutputFile out (
        fileName,
        width,
        height, // image size
        tileWidth,
        tileHeight,    // tile size
        RIPMAP_LEVELS, // level mode
        ROUND_DOWN,    // rounding mode
        WRITE_RGBA);   // channels in file

    Array2D<Rgba> pixels (tileHeight, tileWidth);

    for (int yLevel = 0; yLevel < out.numYLevels (); ++yLevel)
    {
        for (int xLevel = 0; xLevel < out.numXLevels (); ++xLevel)
        {
            for (int tileY = 0; tileY < out.numYTiles (yLevel); ++tileY)
            {
                for (int tileX = 0; tileX < out.numXTiles (xLevel); ++tileX)
                {
                    Box2i range =
                        out.dataWindowForTile (tileX, tileY, xLevel, yLevel);

                    drawImage5 (
                        pixels,
                        out.levelWidth (xLevel),
                        out.levelHeight (yLevel),
                        range.min.x,
                        range.max.x + 1,
                        range.min.y,
                        range.max.y + 1,
                        xLevel,
                        yLevel);

                    out.setFrameBuffer (
                        &pixels[-range.min.y][-range.min.x],
                        1,          // xStride
                        tileWidth); // yStride

                    out.writeTile (tileX, tileY, xLevel, yLevel);
                }
            }
        }
    }
}